

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O3

int refs_from_header(refs_t *r,cram_fd *fd,SAM_hdr *h)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  char cVar4;
  uint uVar5;
  int iVar6;
  khint_t kVar7;
  ref_entry **pprVar8;
  ref_entry *prVar9;
  char *pcVar10;
  SAM_hdr_type *type;
  SAM_hdr_tag *pSVar11;
  byte bVar12;
  char *pcVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  khint32_t *pkVar17;
  uint uVar18;
  int iVar19;
  int n;
  int local_7c;
  cram_fd *local_78;
  refs_t *local_70;
  long local_68;
  ulong local_60;
  long local_58;
  kh_refs_t *local_50;
  ulong local_48;
  khint32_t *local_40;
  char *local_38;
  long lVar20;
  
  if ((fd != (cram_fd *)0x0) && ((long)*(int *)&fd->ctr != 0)) {
    pprVar8 = (ref_entry **)realloc(r->ref_id,((long)r->nref + (long)*(int *)&fd->ctr) * 8);
    r->ref_id = pprVar8;
    if (pprVar8 == (ref_entry **)0x0) {
      return -1;
    }
    local_60 = (ulong)(uint)r->nref;
    iVar19 = *(int *)&fd->ctr;
    if (0 < iVar19) {
      local_68 = 0;
      local_78 = fd;
      local_70 = r;
      do {
        local_50 = r->h_meta;
        local_58 = local_68 * 0x20;
        uVar16 = local_50->n_buckets;
        uVar15 = 0;
        if (uVar16 == 0) {
LAB_0012498d:
          r = local_70;
          fd = local_78;
          if (uVar15 == uVar16) goto LAB_00124995;
        }
        else {
          pcVar10 = *(char **)(*(long *)&fd->first_base + local_58);
          uVar18 = (uint)*pcVar10;
          if (*pcVar10 == '\0') {
            uVar18 = 0;
          }
          else {
            cVar4 = pcVar10[1];
            if (cVar4 != '\0') {
              pcVar13 = pcVar10 + 2;
              do {
                uVar18 = (int)cVar4 + uVar18 * 0x1f;
                cVar4 = *pcVar13;
                pcVar13 = pcVar13 + 1;
              } while (cVar4 != '\0');
            }
          }
          uVar18 = uVar18 & uVar16 - 1;
          pkVar17 = local_50->flags;
          iVar14 = 1;
          uVar15 = uVar18;
          local_48 = (ulong)uVar16;
          local_40 = pkVar17;
          local_38 = pcVar10;
          do {
            uVar1 = pkVar17[uVar15 >> 4];
            bVar12 = (char)uVar15 * '\x02' & 0x1e;
            uVar5 = uVar1 >> bVar12;
            if (((uVar5 & 2) != 0) ||
               (((uVar5 & 1) == 0 &&
                (iVar6 = strcmp(local_50->keys[uVar15],pcVar10), pcVar10 = local_38,
                pkVar17 = local_40, iVar6 == 0)))) {
              uVar16 = (uint)local_48;
              if ((uVar1 >> bVar12 & 3) != 0) {
                uVar15 = uVar16;
              }
              goto LAB_0012498d;
            }
            uVar15 = uVar15 + iVar14 & uVar16 - 1;
            iVar14 = iVar14 + 1;
          } while (uVar15 != uVar18);
LAB_00124995:
          prVar9 = (ref_entry *)calloc(1,0x38);
          lVar3 = local_58;
          lVar2 = local_68;
          r = local_70;
          fd = local_78;
          iVar19 = (int)local_60;
          lVar20 = (long)iVar19;
          local_70->ref_id[lVar20] = prVar9;
          if (prVar9 == (ref_entry *)0x0) {
            return -1;
          }
          if (*(long *)(*(long *)&local_78->first_base + lVar20 * 0x20) == 0) {
            return -1;
          }
          pcVar10 = string_dup(local_70->pool,*(char **)(*(long *)&local_78->first_base + local_58))
          ;
          pprVar8 = r->ref_id;
          pprVar8[lVar20]->name = pcVar10;
          pprVar8[lVar20]->length = 0;
          type = sam_hdr_find((SAM_hdr *)fd,"SQ","SN",*(char **)(*(long *)&fd->first_base + lVar3));
          if ((type != (SAM_hdr_type *)0x0) &&
             (pSVar11 = sam_hdr_find_key((SAM_hdr *)fd,type,"M5",(SAM_hdr_tag **)0x0),
             pSVar11 != (SAM_hdr_tag *)0x0)) {
            pcVar10 = string_dup(r->pool,pSVar11->str + 3);
            r->ref_id[lVar20]->fn = pcVar10;
          }
          kVar7 = kh_put_refs(r->h_meta,r->ref_id[lVar20]->name,&local_7c);
          if (local_7c < 1) {
            return -1;
          }
          r->h_meta->vals[kVar7] = r->ref_id[lVar20];
          local_60 = (ulong)(iVar19 + 1);
          iVar19 = *(int *)&fd->ctr;
          local_68 = lVar2;
        }
        local_68 = local_68 + 1;
      } while (local_68 < iVar19);
    }
    r->nref = (int)local_60;
  }
  return 0;
}

Assistant:

static int refs_from_header(refs_t *r, cram_fd *fd, SAM_hdr *h) {
    int i, j;

    if (!h || h->nref == 0)
	return 0;

    //fprintf(stderr, "refs_from_header for %p mode %c\n", fd, fd->mode);

    /* Existing refs are fine, as long as they're compatible with the hdr. */
    if (!(r->ref_id = realloc(r->ref_id, (r->nref + h->nref) * sizeof(*r->ref_id))))
	return -1;

    /* Copy info from h->ref[i] over to r */
    for (i = 0, j = r->nref; i < h->nref; i++) {
	SAM_hdr_type *ty;
	SAM_hdr_tag *tag;
	khint_t k;
	int n;

	k = kh_get(refs, r->h_meta, h->ref[i].name);
	if (k != kh_end(r->h_meta))
	    // Ref already known about
	    continue;

	if (!(r->ref_id[j] = calloc(1, sizeof(ref_entry))))
	    return -1;

	if (!h->ref[j].name)
	    return -1;

	r->ref_id[j]->name = string_dup(r->pool, h->ref[i].name);
	r->ref_id[j]->length = 0; // marker for not yet loaded

	/* Initialise likely filename if known */
	if ((ty = sam_hdr_find(h, "SQ", "SN", h->ref[i].name))) {
	    if ((tag = sam_hdr_find_key(h, ty, "M5", NULL))) {
		r->ref_id[j]->fn = string_dup(r->pool, tag->str+3);
		//fprintf(stderr, "Tagging @SQ %s / %s\n", r->ref_id[h]->name, r->ref_id[h]->fn);
	    }
	}

	k = kh_put(refs, r->h_meta, r->ref_id[j]->name, &n);
	if (n <= 0) // already exists or error
	    return -1;
	kh_val(r->h_meta, k) = r->ref_id[j];

	j++;
    }
    r->nref = j;

    return 0;
}